

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O3

boolean save_marker(j_decompress_ptr cinfo)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  jpeg_marker_reader *pjVar4;
  jpeg_source_mgr *pjVar5;
  jpeg_error_mgr *pjVar6;
  boolean bVar7;
  jpeg_marker_parser_method *pp_Var8;
  jpeg_saved_marker_ptr pjVar9;
  uint uVar10;
  byte *pbVar11;
  byte *pbVar12;
  long lVar13;
  JOCTET *data;
  jpeg_saved_marker_ptr pjVar14;
  ulong uVar15;
  uint datalen;
  ulong uVar16;
  size_t sVar17;
  bool bVar18;
  jpeg_saved_marker_ptr local_38;
  
  pjVar4 = cinfo->marker;
  local_38 = (jpeg_saved_marker_ptr)pjVar4[6].read_markers;
  pjVar5 = cinfo->src;
  pbVar12 = pjVar5->next_input_byte;
  sVar17 = pjVar5->bytes_in_buffer;
  if (local_38 == (jpeg_saved_marker_ptr)0x0) {
    if (sVar17 == 0) {
      bVar7 = (*pjVar5->fill_input_buffer)(cinfo);
      if (bVar7 == 0) {
        return 0;
      }
      pbVar12 = pjVar5->next_input_byte;
      sVar17 = pjVar5->bytes_in_buffer;
    }
    bVar2 = *pbVar12;
    sVar17 = sVar17 - 1;
    if (sVar17 == 0) {
      bVar7 = (*pjVar5->fill_input_buffer)(cinfo);
      if (bVar7 == 0) {
        return 0;
      }
      pbVar11 = pjVar5->next_input_byte;
      sVar17 = pjVar5->bytes_in_buffer;
    }
    else {
      pbVar11 = pbVar12 + 1;
    }
    sVar17 = sVar17 - 1;
    pbVar12 = pbVar11 + 1;
    uVar15 = ((ulong)bVar2 * 0x100 + (ulong)*pbVar11) - 2;
    if (((ulong)bVar2 * 0x100 | (ulong)*pbVar11) < 2) {
      datalen = 0;
      data = (JOCTET *)0x0;
      goto LAB_00277292;
    }
    pp_Var8 = (jpeg_marker_parser_method *)((long)pjVar4 + (long)cinfo->unread_marker * 4 + -0x2cc);
    if ((long)cinfo->unread_marker == 0xfe) {
      pp_Var8 = &pjVar4[4].read_restart_marker;
    }
    uVar16 = (ulong)*(uint *)pp_Var8;
    if ((uint)uVar15 <= *(uint *)pp_Var8) {
      uVar16 = uVar15 & 0xffffffff;
    }
    local_38 = (jpeg_saved_marker_ptr)
               (*cinfo->mem->alloc_large)((j_common_ptr)cinfo,1,uVar16 + 0x20);
    local_38->next = (jpeg_saved_marker_ptr)0x0;
    local_38->marker = (UINT8)*(code *)&cinfo->unread_marker;
    local_38->original_length = (uint)uVar15;
    local_38->data_length = (uint)uVar16;
    pjVar14 = local_38 + 1;
    local_38->data = (JOCTET *)pjVar14;
    pjVar4[6].read_markers = (_func_int_j_decompress_ptr *)local_38;
    *(undefined4 *)&pjVar4[6].read_restart_marker = 0;
    uVar15 = 0;
  }
  else {
    uVar15 = (ulong)*(uint *)&pjVar4[6].read_restart_marker;
    uVar16 = (ulong)local_38->data_length;
    pjVar14 = (jpeg_saved_marker_ptr)(local_38->data + uVar15);
  }
  while( true ) {
    uVar10 = (uint)uVar15;
    datalen = (uint)uVar16;
    if (datalen <= uVar10) break;
    pjVar5->next_input_byte = pbVar12;
    pjVar5->bytes_in_buffer = sVar17;
    *(uint *)&pjVar4[6].read_restart_marker = uVar10;
    if (sVar17 == 0) {
      bVar7 = (*pjVar5->fill_input_buffer)(cinfo);
      if (bVar7 == 0) {
        return 0;
      }
      pbVar12 = pjVar5->next_input_byte;
      sVar17 = pjVar5->bytes_in_buffer;
    }
    if ((uVar10 < datalen) && (sVar17 != 0)) {
      lVar13 = 0;
      do {
        *(byte *)((long)&pjVar14->next + lVar13) = pbVar12[lVar13];
        lVar1 = lVar13 + 1;
        if (datalen <= uVar10 + (int)lVar13 + 1) break;
        bVar18 = sVar17 - 1 != lVar13;
        lVar13 = lVar1;
      } while (bVar18);
      sVar17 = sVar17 - lVar1;
      pbVar12 = pbVar12 + lVar1;
      pjVar14 = (jpeg_saved_marker_ptr)((long)&pjVar14->next + lVar1);
      uVar15 = (ulong)(uVar10 + (int)lVar1);
    }
  }
  pjVar14 = cinfo->marker_list;
  if (cinfo->marker_list == (jpeg_saved_marker_ptr)0x0) {
    pjVar9 = (jpeg_saved_marker_ptr)&cinfo->marker_list;
  }
  else {
    do {
      pjVar9 = pjVar14;
      pjVar14 = pjVar9->next;
    } while (pjVar9->next != (jpeg_saved_marker_ptr)0x0);
  }
  pjVar9->next = local_38;
  data = local_38->data;
  uVar15 = (ulong)(local_38->original_length - datalen);
LAB_00277292:
  pjVar4[6].read_markers = (_func_int_j_decompress_ptr *)0x0;
  iVar3 = cinfo->unread_marker;
  if (iVar3 == 0xee) {
    examine_app14(cinfo,data,datalen,uVar15);
  }
  else if (iVar3 == 0xe0) {
    examine_app0(cinfo,data,datalen,uVar15);
  }
  else {
    pjVar6 = cinfo->err;
    pjVar6->msg_code = 0x5d;
    (pjVar6->msg_parm).i[0] = iVar3;
    (cinfo->err->msg_parm).i[1] = datalen + (int)uVar15;
    (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
  }
  pjVar5->next_input_byte = pbVar12;
  pjVar5->bytes_in_buffer = sVar17;
  if (0 < (long)uVar15) {
    (*cinfo->src->skip_input_data)(cinfo,uVar15);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
save_marker (j_decompress_ptr cinfo)
/* Save an APPn or COM marker into the marker list */
{
  my_marker_ptr marker = (my_marker_ptr) cinfo->marker;
  jpeg_saved_marker_ptr cur_marker = marker->cur_marker;
  unsigned int bytes_read, data_length;
  JOCTET FAR * data;
  INT32 length = 0;
  INPUT_VARS(cinfo);

  if (cur_marker == NULL) {
    /* begin reading a marker */
    INPUT_2BYTES(cinfo, length, return FALSE);
    length -= 2;
    if (length >= 0) {		/* watch out for bogus length word */
      /* figure out how much we want to save */
      unsigned int limit;
      if (cinfo->unread_marker == (int) M_COM)
	limit = marker->length_limit_COM;
      else
	limit = marker->length_limit_APPn[cinfo->unread_marker - (int) M_APP0];
      if ((unsigned int) length < limit)
	limit = (unsigned int) length;
      /* allocate and initialize the marker item */
      cur_marker = (jpeg_saved_marker_ptr)
	(*cinfo->mem->alloc_large) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				    SIZEOF(struct jpeg_marker_struct) + limit);
      cur_marker->next = NULL;
      cur_marker->marker = (UINT8) cinfo->unread_marker;
      cur_marker->original_length = (unsigned int) length;
      cur_marker->data_length = limit;
      /* data area is just beyond the jpeg_marker_struct */
      data = cur_marker->data = (JOCTET FAR *) (cur_marker + 1);
      marker->cur_marker = cur_marker;
      marker->bytes_read = 0;
      bytes_read = 0;
      data_length = limit;
    } else {
      /* deal with bogus length word */
      bytes_read = data_length = 0;
      data = NULL;
    }
  } else {
    /* resume reading a marker */
    bytes_read = marker->bytes_read;
    data_length = cur_marker->data_length;
    data = cur_marker->data + bytes_read;
  }

  while (bytes_read < data_length) {
    INPUT_SYNC(cinfo);		/* move the restart point to here */
    marker->bytes_read = bytes_read;
    /* If there's not at least one byte in buffer, suspend */
    MAKE_BYTE_AVAIL(cinfo, return FALSE);
    /* Copy bytes with reasonable rapidity */
    while (bytes_read < data_length && bytes_in_buffer > 0) {
      *data++ = *next_input_byte++;
      bytes_in_buffer--;
      bytes_read++;
    }
  }

  /* Done reading what we want to read */
  if (cur_marker != NULL) {	/* will be NULL if bogus length word */
    /* Add new marker to end of list */
    if (cinfo->marker_list == NULL) {
      cinfo->marker_list = cur_marker;
    } else {
      jpeg_saved_marker_ptr prev = cinfo->marker_list;
      while (prev->next != NULL)
	prev = prev->next;
      prev->next = cur_marker;
    }
    /* Reset pointer & calc remaining data length */
    data = cur_marker->data;
    length = cur_marker->original_length - data_length;
  }
  /* Reset to initial state for next marker */
  marker->cur_marker = NULL;

  /* Process the marker if interesting; else just make a generic trace msg */
  switch (cinfo->unread_marker) {
  case M_APP0:
    examine_app0(cinfo, data, data_length, length);
    break;
  case M_APP14:
    examine_app14(cinfo, data, data_length, length);
    break;
  default:
    TRACEMS2(cinfo, 1, JTRC_MISC_MARKER, cinfo->unread_marker,
	     (int) (data_length + length));
    break;
  }

  /* skip any remaining data -- could be lots */
  INPUT_SYNC(cinfo);		/* do before skip_input_data */
  if (length > 0)
    (*cinfo->src->skip_input_data) (cinfo, (long) length);

  return TRUE;
}